

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O2

bool __thiscall
CDBIterator::GetKey<(anonymous_namespace)::DBHeightKey>(CDBIterator *this,DBHeightKey *key)

{
  long lVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  DataStream ssKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sp = GetKeyImpl(this);
  DataStream::DataStream(&ssKey,sp);
  uVar2 = ser_readdata8<DataStream>(&ssKey);
  if (uVar2 == 't') {
    uVar3 = ser_readdata32be<DataStream>(&ssKey);
    key->height = uVar3;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssKey);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return true;
    }
  }
  else {
    pcVar4 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"Invalid format for block filter index DB height key");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool GetKey(K& key) {
        try {
            DataStream ssKey{GetKeyImpl()};
            ssKey >> key;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }